

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_markdown_generator.cc
# Opt level: O1

void __thiscall
t_markdown_generator::generate_service(t_markdown_generator *this,t_service *tservice)

{
  ofstream_with_content_based_conditional_update *poVar1;
  pointer pcVar2;
  bool bVar3;
  ostream *poVar4;
  pointer pptVar5;
  pointer pptVar6;
  vector<t_field_*,_std::allocator<t_field_*>_> args;
  string fn_name;
  vector<t_field_*,_std::allocator<t_field_*>_> excepts;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  char local_99;
  vector<t_field_*,_std::allocator<t_field_*>_> local_98;
  char *local_80;
  long local_78;
  char local_70 [16];
  vector<t_field_*,_std::allocator<t_field_*>_> local_60;
  vector<t_function_*,_std::allocator<t_function_*>_> local_48;
  
  poVar1 = &this->f_out_;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"### Service: ",0xd);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,(this->super_t_generator).service_name_._M_dataplus._M_p,
                      (this->super_t_generator).service_name_._M_string_length);
  local_80._0_1_ = (string)0xa;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_80,1);
  if (tservice->extends_ != (t_service *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"**extends ** _",0xe);
    print_type(this,&tservice->extends_->super_t_type);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"_",1);
    local_80._0_1_ = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)&local_80,1);
  }
  print_doc(this,(t_doc *)tservice);
  local_80 = (char *)CONCAT71(local_80._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)&local_80,1);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector(&local_48,&tservice->functions_);
  pptVar6 = local_48.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (local_48.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      local_80 = local_70;
      pcVar2 = ((*pptVar6)->name_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,pcVar2,pcVar2 + ((*pptVar6)->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"#### Function: ",0xf);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)poVar1,(this->super_t_generator).service_name_._M_dataplus._M_p
                          ,(this->super_t_generator).service_name_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,".",1);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_80,local_78);
      local_98.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_98,1);
      print_doc(this,&(*pptVar6)->super_t_doc);
      local_98.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ = 10;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)poVar1,(char *)&local_98,1);
      local_98.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_98,1);
      print_type(this,(*pptVar6)->returntype_);
      local_98.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ = 10;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)poVar1,(char *)&local_98,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," _",2);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_80,local_78);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_(",2);
      std::vector<t_field_*,_std::allocator<t_field_*>_>::vector
                (&local_98,&(*pptVar6)->arglist_->members_);
      pptVar5 = (pointer)CONCAT71(local_98.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                  local_98.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start._0_1_);
      if (pptVar5 !=
          local_98.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        bVar3 = true;
        do {
          if (!bVar3) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
            local_60.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start._0_1_ = 10;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,(char *)&local_60,1);
          }
          print_type(this,(*pptVar5)->type_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," ",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,((*pptVar5)->name_)._M_dataplus._M_p,
                     ((*pptVar5)->name_)._M_string_length);
          if ((*pptVar5)->value_ != (t_const_value *)0x0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," = ",3);
            print_const_value(this,(*pptVar5)->type_,(*pptVar5)->value_);
          }
          pptVar5 = pptVar5 + 1;
          bVar3 = false;
        } while (pptVar5 !=
                 local_98.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")",1);
      local_60.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)&local_60,1);
      std::vector<t_field_*,_std::allocator<t_field_*>_>::vector
                (&local_60,&(*pptVar6)->xceptions_->members_);
      pptVar5 = (pointer)CONCAT71(local_60.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                  local_60.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start._0_1_);
      if (pptVar5 !=
          local_60.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"> throws ",9);
        if (pptVar5 !=
            local_60.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          bVar3 = true;
          do {
            if (!bVar3) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
            }
            print_type(this,(*pptVar5)->type_);
            pptVar5 = pptVar5 + 1;
            bVar3 = false;
          } while (pptVar5 !=
                   local_60.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        }
        local_99 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,&local_99,1);
      }
      print_fn_args_doc(this,*pptVar6);
      local_99 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,&local_99,1);
      if ((void *)CONCAT71(local_60.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,
                           local_60.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                           _M_impl.super__Vector_impl_data._M_start._0_1_) != (void *)0x0) {
        operator_delete((void *)CONCAT71(local_60.
                                         super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                                         _M_impl.super__Vector_impl_data._M_start._1_7_,
                                         local_60.
                                         super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                                         _M_impl.super__Vector_impl_data._M_start._0_1_));
      }
      if ((void *)CONCAT71(local_98.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,
                           local_98.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                           _M_impl.super__Vector_impl_data._M_start._0_1_) != (void *)0x0) {
        operator_delete((void *)CONCAT71(local_98.
                                         super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                                         _M_impl.super__Vector_impl_data._M_start._1_7_,
                                         local_98.
                                         super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                                         _M_impl.super__Vector_impl_data._M_start._0_1_));
      }
      if (local_80 != local_70) {
        operator_delete(local_80);
      }
      pptVar6 = pptVar6 + 1;
    } while (pptVar6 !=
             local_48.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (local_48.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void t_markdown_generator::generate_service(t_service* tservice) {
  f_out_ << "### Service: " << service_name_ << endl;

  if (tservice->get_extends()) {
    f_out_ << "**extends ** _";
    print_type(tservice->get_extends());
    f_out_ << "_" << endl;
  }

  print_doc(tservice);
  f_out_ << endl;

  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator fn_iter = functions.begin();
  for (; fn_iter != functions.end(); fn_iter++) {
    string fn_name = (*fn_iter)->get_name();
    f_out_ << "#### Function: " << service_name_ << "." << fn_name << endl;
    print_doc(*fn_iter);
    f_out_ << endl << endl;
    print_type((*fn_iter)->get_returntype());
    bool first = true;
    f_out_ << endl << " _" << fn_name << "_(";
    vector<t_field*> args = (*fn_iter)->get_arglist()->get_members();
    vector<t_field*>::iterator arg_iter = args.begin();
    for (; arg_iter != args.end(); arg_iter++) {
      if (!first) {
        f_out_ << "," << endl;
      }
      first = false;
      print_type((*arg_iter)->get_type());
      f_out_ << " " << (*arg_iter)->get_name();
      if ((*arg_iter)->get_value() != nullptr) {
        f_out_ << " = ";
        print_const_value((*arg_iter)->get_type(), (*arg_iter)->get_value());
      }
    }
    f_out_ << ")" << endl;
    first = true;
    vector<t_field*> excepts = (*fn_iter)->get_xceptions()->get_members();
    vector<t_field*>::iterator ex_iter = excepts.begin();
    if (ex_iter != excepts.end()) {
      f_out_ << "> throws ";
      for (; ex_iter != excepts.end(); ex_iter++) {
        if (!first) {
          f_out_ << ", ";
        }
        first = false;
        print_type((*ex_iter)->get_type());
      }
      f_out_ << endl;
    }
    print_fn_args_doc(*fn_iter);
    f_out_ << endl;
  }
}